

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_folding_rules.cpp
# Opt level: O2

Constant *
spvtools::opt::anon_unknown_0::NegateFPConst
          (Type *result_type,Constant *val,ConstantManager *const_mgr)

{
  int iVar1;
  undefined4 extraout_var;
  Constant *pCVar2;
  float fVar3;
  double dVar4;
  
  iVar1 = (*result_type->_vptr_Type[0xc])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    __assert_fail("float_type != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/const_folding_rules.cpp"
                  ,0x50,
                  "const analysis::Constant *spvtools::opt::(anonymous namespace)::NegateFPConst(const analysis::Type *, const analysis::Constant *, analysis::ConstantManager *)"
                 );
  }
  iVar1 = *(int *)(CONCAT44(extraout_var,iVar1) + 0x24);
  if (iVar1 != 0x40) {
    if (iVar1 == 0x20) {
      fVar3 = analysis::Constant::GetFloat(val);
      pCVar2 = analysis::ConstantManager::GetFloatConst(const_mgr,-fVar3);
      return pCVar2;
    }
    return (Constant *)0x0;
  }
  dVar4 = analysis::Constant::GetDouble(val);
  pCVar2 = analysis::ConstantManager::GetDoubleConst(const_mgr,-dVar4);
  return pCVar2;
}

Assistant:

const analysis::Constant* NegateFPConst(const analysis::Type* result_type,
                                        const analysis::Constant* val,
                                        analysis::ConstantManager* const_mgr) {
  const analysis::Float* float_type = result_type->AsFloat();
  assert(float_type != nullptr);
  if (float_type->width() == 32) {
    float fa = val->GetFloat();
    return const_mgr->GetFloatConst(-fa);
  } else if (float_type->width() == 64) {
    double da = val->GetDouble();
    return const_mgr->GetDoubleConst(-da);
  }
  return nullptr;
}